

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uchar *__n;
  char cVar5;
  long lVar6;
  uint uVar7;
  uchar local_418 [1024];
  
  if ((mode != 1) || (iVar3 = -0x4080, ctx->padding == 0)) {
    sVar1 = ctx->len;
    iVar3 = -0x4080;
    if (0xfffffffffffffc0e < sVar1 - 0x401) {
      if (mode == 0) {
        iVar3 = mbedtls_rsa_public(ctx,input,local_418);
      }
      else {
        iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,local_418);
      }
      if (iVar3 == 0) {
        uVar4 = 0;
        lVar6 = 0;
        uVar7 = 0;
        bVar2 = false;
        if (mode == 1) {
          for (; sVar1 - 3 != lVar6; lVar6 = lVar6 + 1) {
            uVar7 = local_418[lVar6 + 2] == '\0' | uVar7;
            uVar4 = uVar4 + ((-uVar7 & 0xff) >> 7 ^ 1);
          }
          cVar5 = '\x02';
        }
        else {
          for (; sVar1 - 3 != lVar6; lVar6 = lVar6 + 1) {
            bVar2 = (bool)(bVar2 | local_418[lVar6 + 2] != 0xff);
            uVar4 = uVar4 + !bVar2;
          }
          cVar5 = '\x01';
        }
        iVar3 = -0x4100;
        if (7 < uVar4 &&
            ((local_418[1] == cVar5 && local_418[uVar4 + 2] == '\0') && local_418[0] == '\0')) {
          __n = local_418 + (sVar1 - (long)(local_418 + uVar4 + 3));
          iVar3 = -0x4400;
          if (__n <= output_max_len) {
            *olen = (size_t)__n;
            memcpy(output,local_418 + uVar4 + 3,(size_t)__n);
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t *olen,
                                 const unsigned char *input,
                                 unsigned char *output,
                                 size_t output_max_len)
{
    int ret;
    size_t ilen, pad_count = 0, i;
    unsigned char *p, bad, pad_done = 0;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    p = buf;
    bad = 0;

    /*
     * Check and get padding len in "constant-time"
     */
    bad |= *p++; /* First byte must be 0 */

    /* This test does not depend on secret data */
    if( mode == MBEDTLS_RSA_PRIVATE )
    {
        bad |= *p++ ^ MBEDTLS_RSA_CRYPT;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done  |= ((p[i] | (unsigned char)-p[i]) >> 7) ^ 1;
            pad_count += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }
    else
    {
        bad |= *p++ ^ MBEDTLS_RSA_SIGN;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done |= ( p[i] != 0xFF );
            pad_count += ( pad_done == 0 );
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }

    bad |= ( pad_count < 8 );

    if( bad )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}